

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O2

void __thiscall
gtl::
dense_hashtable<unsigned_int,_unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::Identity,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::SetKey,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>
::rebucket(dense_hashtable<unsigned_int,_unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::Identity,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::SetKey,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>
           *this,size_type new_num_buckets)

{
  move_iterator<gtl::dense_hashtable_iterator<unsigned_int,_unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::Identity,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::SetKey,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>_>
  src_first;
  move_iterator<gtl::dense_hashtable_iterator<unsigned_int,_unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::Identity,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::SetKey,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>_>
  src_last;
  uint *puVar1;
  iterator local_50;
  iterator local_38;
  
  if (this->table == (pointer)0x0) {
    this->num_buckets = new_num_buckets;
  }
  else {
    if ((this->settings).
        super_sh_hashtable_settings<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_unsigned_long,_4>
        .use_empty_ == false) {
      __assert_fail("settings.use_empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/densehashtable.h"
                    ,0x2d9,
                    "void gtl::dense_hashtable<unsigned int, unsigned int, SequenceLexicon<int>::IdHasher, gtl::dense_hash_set<unsigned int, SequenceLexicon<int>::IdHasher, SequenceLexicon<int>::IdKeyEqual>::Identity, gtl::dense_hash_set<unsigned int, SequenceLexicon<int>::IdHasher, SequenceLexicon<int>::IdKeyEqual>::SetKey, SequenceLexicon<int>::IdKeyEqual, std::allocator<unsigned int>>::rebucket(size_type) [Value = unsigned int, Key = unsigned int, HashFcn = SequenceLexicon<int>::IdHasher, ExtractKey = gtl::dense_hash_set<unsigned int, SequenceLexicon<int>::IdHasher, SequenceLexicon<int>::IdKeyEqual>::Identity, SetKey = gtl::dense_hash_set<unsigned int, SequenceLexicon<int>::IdHasher, SequenceLexicon<int>::IdKeyEqual>::SetKey, EqualKey = SequenceLexicon<int>::IdKeyEqual, Alloc = std::allocator<unsigned int>]"
                   );
    }
    if ((new_num_buckets & new_num_buckets - 1) != 0) {
      __assert_fail("(new_num_buckets & (new_num_buckets - 1)) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/densehashtable.h"
                    ,0x2da,
                    "void gtl::dense_hashtable<unsigned int, unsigned int, SequenceLexicon<int>::IdHasher, gtl::dense_hash_set<unsigned int, SequenceLexicon<int>::IdHasher, SequenceLexicon<int>::IdKeyEqual>::Identity, gtl::dense_hash_set<unsigned int, SequenceLexicon<int>::IdHasher, SequenceLexicon<int>::IdKeyEqual>::SetKey, SequenceLexicon<int>::IdKeyEqual, std::allocator<unsigned int>>::rebucket(size_type) [Value = unsigned int, Key = unsigned int, HashFcn = SequenceLexicon<int>::IdHasher, ExtractKey = gtl::dense_hash_set<unsigned int, SequenceLexicon<int>::IdHasher, SequenceLexicon<int>::IdKeyEqual>::Identity, SetKey = gtl::dense_hash_set<unsigned int, SequenceLexicon<int>::IdHasher, SequenceLexicon<int>::IdKeyEqual>::SetKey, EqualKey = SequenceLexicon<int>::IdKeyEqual, Alloc = std::allocator<unsigned int>]"
                   );
    }
    if (((this->settings).
         super_sh_hashtable_settings<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_unsigned_long,_4>
         .shrink_factor_ <= 0.0) && (new_num_buckets < this->num_buckets)) {
      __assert_fail("settings.shrink_factor() > 0 || new_num_buckets >= num_buckets",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/densehashtable.h"
                    ,0x2dc,
                    "void gtl::dense_hashtable<unsigned int, unsigned int, SequenceLexicon<int>::IdHasher, gtl::dense_hash_set<unsigned int, SequenceLexicon<int>::IdHasher, SequenceLexicon<int>::IdKeyEqual>::Identity, gtl::dense_hash_set<unsigned int, SequenceLexicon<int>::IdHasher, SequenceLexicon<int>::IdKeyEqual>::SetKey, SequenceLexicon<int>::IdKeyEqual, std::allocator<unsigned int>>::rebucket(size_type) [Value = unsigned int, Key = unsigned int, HashFcn = SequenceLexicon<int>::IdHasher, ExtractKey = gtl::dense_hash_set<unsigned int, SequenceLexicon<int>::IdHasher, SequenceLexicon<int>::IdKeyEqual>::Identity, SetKey = gtl::dense_hash_set<unsigned int, SequenceLexicon<int>::IdHasher, SequenceLexicon<int>::IdKeyEqual>::SetKey, EqualKey = SequenceLexicon<int>::IdKeyEqual, Alloc = std::allocator<unsigned int>]"
                   );
    }
    puVar1 = __gnu_cxx::new_allocator<unsigned_int>::allocate
                       ((new_allocator<unsigned_int> *)&this->key_info,new_num_buckets,(void *)0x0);
    fill_range_with_empty(this,puVar1,puVar1 + new_num_buckets);
    begin(&local_38,this);
    end(&local_50,this);
    src_first._M_current.pos = local_38.pos;
    src_first._M_current.ht = local_38.ht;
    src_first._M_current.end = local_38.end;
    src_last._M_current.pos = local_50.pos;
    src_last._M_current.ht = local_50.ht;
    src_last._M_current.end = local_50.end;
    dense_hashtable<unsigned_int,unsigned_int,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdHasher,gtl::dense_hash_set<unsigned_int,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdHasher,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdKeyEqual,std::allocator<unsigned_int>>::Identity,gtl::dense_hash_set<unsigned_int,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdHasher,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdKeyEqual,std::allocator<unsigned_int>>::SetKey,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdKeyEqual,std::allocator<unsigned_int>>
    ::
    copy_elements<std::move_iterator<gtl::dense_hashtable_iterator<unsigned_int,unsigned_int,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdHasher,gtl::dense_hash_set<unsigned_int,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdHasher,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdKeyEqual,std::allocator<unsigned_int>>::Identity,gtl::dense_hash_set<unsigned_int,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdHasher,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdKeyEqual,std::allocator<unsigned_int>>::SetKey,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdKeyEqual,std::allocator<unsigned_int>>>>
              ((dense_hashtable<unsigned_int,unsigned_int,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdHasher,gtl::dense_hash_set<unsigned_int,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdHasher,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdKeyEqual,std::allocator<unsigned_int>>::Identity,gtl::dense_hash_set<unsigned_int,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdHasher,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdKeyEqual,std::allocator<unsigned_int>>::SetKey,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdKeyEqual,std::allocator<unsigned_int>>
                *)this,src_first,src_last,puVar1,new_num_buckets);
    operator_delete(this->table);
    this->table = puVar1;
    this->num_buckets = new_num_buckets;
    if (this->num_elements < this->num_deleted) {
      __assert_fail("num_elements >= num_deleted",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/densehashtable.h"
                    ,0x2e9,
                    "void gtl::dense_hashtable<unsigned int, unsigned int, SequenceLexicon<int>::IdHasher, gtl::dense_hash_set<unsigned int, SequenceLexicon<int>::IdHasher, SequenceLexicon<int>::IdKeyEqual>::Identity, gtl::dense_hash_set<unsigned int, SequenceLexicon<int>::IdHasher, SequenceLexicon<int>::IdKeyEqual>::SetKey, SequenceLexicon<int>::IdKeyEqual, std::allocator<unsigned int>>::rebucket(size_type) [Value = unsigned int, Key = unsigned int, HashFcn = SequenceLexicon<int>::IdHasher, ExtractKey = gtl::dense_hash_set<unsigned int, SequenceLexicon<int>::IdHasher, SequenceLexicon<int>::IdKeyEqual>::Identity, SetKey = gtl::dense_hash_set<unsigned int, SequenceLexicon<int>::IdHasher, SequenceLexicon<int>::IdKeyEqual>::SetKey, EqualKey = SequenceLexicon<int>::IdKeyEqual, Alloc = std::allocator<unsigned int>]"
                   );
    }
    this->num_elements = this->num_elements - this->num_deleted;
    this->num_deleted = 0;
    sh_hashtable_settings<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_unsigned_long,_4>
    ::reset_thresholds((sh_hashtable_settings<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_unsigned_long,_4>
                        *)this,new_num_buckets);
    puVar1 = &(this->settings).
              super_sh_hashtable_settings<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_unsigned_long,_4>
              .num_ht_copies_;
    *puVar1 = *puVar1 + 1;
  }
  return;
}

Assistant:

void rebucket(size_type new_num_buckets) {
    if (table == nullptr) {
      // When we eventually allocate the table, it will have this many buckets.
      num_buckets = new_num_buckets;
      return;
    }
    assert(settings.use_empty());
    assert((new_num_buckets & (new_num_buckets - 1)) == 0);  // a power of two
    // If settings.shrink_factor() is zero then we must not shrink.
    assert(settings.shrink_factor() > 0 || new_num_buckets >= num_buckets);
    pointer new_table = get_internal_allocator().allocate(new_num_buckets);

    fill_range_with_empty(new_table, new_table + new_num_buckets);
    copy_elements(std::make_move_iterator(begin()),
                  std::make_move_iterator(end()),
                  new_table, new_num_buckets);

    destroy_buckets(0, num_buckets);  // Destroy table's elements.
    get_internal_allocator().deallocate(table, num_buckets);

    table = new_table;
    num_buckets = new_num_buckets;
    assert(num_elements >= num_deleted);
    num_elements -= num_deleted;
    num_deleted = 0;
    settings.reset_thresholds(bucket_count());
    settings.inc_num_ht_copies();
  }